

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::DecommitNow(HeapInfo *this,bool all)

{
  IdleDecommitPageAllocator::DecommitNow
            (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator,all);
  IdleDecommitPageAllocator::DecommitNow
            (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator,all);
  IdleDecommitPageAllocator::DecommitNow
            (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator,all);
  IdleDecommitPageAllocator::DecommitNow(this->recyclerLeafPageAllocator,all);
  return;
}

Assistant:

void
HeapInfo::DecommitNow(bool all)
{
    ForEachPageAllocator([=](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->DecommitNow(all);
    });
}